

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::IntToDescriptor
          (ChLinkMateGeneric *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  ChLinkMask *this_00;
  ChConstraintTwoBodies *pCVar1;
  CoeffReturnType pdVar2;
  int i;
  int i_00;
  int iVar3;
  
  this_00 = &this->mask;
  iVar3 = 0;
  for (i_00 = 0; i_00 < (this->mask).nconstr; i_00 = i_00 + 1) {
    pCVar1 = ChLinkMask::Constr_N(this_00,i_00);
    if ((pCVar1->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pCVar1 = ChLinkMask::Constr_N(this_00,i_00);
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar1->super_ChConstraintTwo).super_ChConstraint.l_i = *pdVar2;
      pCVar1 = ChLinkMask::Constr_N(this_00,i_00);
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar1->super_ChConstraintTwo).super_ChConstraint.b_i = *pdVar2;
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntToDescriptor(const unsigned int off_v,
                                        const ChStateDelta& v,
                                        const ChVectorDynamic<>& R,
                                        const unsigned int off_L,
                                        const ChVectorDynamic<>& L,
                                        const ChVectorDynamic<>& Qc) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            mask.Constr_N(i).Set_l_i(L(off_L + cnt));
            mask.Constr_N(i).Set_b_i(Qc(off_L + cnt));
            cnt++;
        }
    }
}